

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncSocket.h
# Opt level: O0

ssize_t __thiscall
uWS::AsyncSocket<false>::write(AsyncSocket<false> *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  LoopData *pLVar4;
  string *this_00;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  pair<int,_bool> pVar8;
  undefined4 in_register_00000034;
  int in_R8D;
  int written_1;
  int written;
  AsyncSocketData<false> *asyncSocketData;
  LoopData *loopData;
  bool local_6f;
  bool local_6e;
  bool local_6d;
  int local_6c;
  bool local_66;
  bool in_stack_ffffffffffffff9b;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  AsyncSocket<false> *in_stack_ffffffffffffffa8;
  bool local_25;
  int local_24;
  byte local_1d;
  int local_1c;
  void *local_18;
  AsyncSocket<false> *local_10;
  pair<int,_bool> local_8;
  
  local_18 = (void *)CONCAT44(in_register_00000034,__fd);
  local_1c = (int)__buf;
  local_1d = (byte)__n & 1;
  local_24 = in_R8D;
  local_10 = this;
  iVar1 = us_socket_is_closed(0);
  if (iVar1 != 0) {
    local_25 = false;
    std::pair<int,_bool>::pair<int_&,_bool,_true>(&local_8,&local_1c,&local_25);
    goto LAB_002225de;
  }
  pLVar4 = getLoopData((AsyncSocket<false> *)0x2222fc);
  this_00 = (string *)getAsyncSocketData((AsyncSocket<false> *)0x22230b);
  lVar5 = std::__cxx11::string::length();
  if (lVar5 != 0) {
    uVar6 = std::__cxx11::string::data();
    uVar2 = std::__cxx11::string::length();
    uVar3 = us_socket_write(0,this,uVar6,uVar2,local_1c);
    uVar7 = std::__cxx11::string::length();
    if (uVar3 < uVar7) {
      std::__cxx11::string::substr((ulong)&stack0xffffffffffffffa0,(ulong)this_00);
      std::__cxx11::string::operator=(this_00,(string *)&stack0xffffffffffffffa0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
      if ((local_1d & 1) == 0) {
        std::__cxx11::string::append((char *)this_00,(ulong)local_18);
        local_66 = true;
        std::pair<int,_bool>::pair<int_&,_bool,_true>(&local_8,&local_1c,&local_66);
      }
      else {
        std::pair<int,_bool>::pair<int,_bool,_true>
                  (&local_8,(int *)&stack0xffffffffffffff9c,(bool *)&stack0xffffffffffffff9b);
      }
      goto LAB_002225de;
    }
    std::__cxx11::string::clear();
  }
  if (local_1c != 0) {
    if ((AsyncSocket<false> *)pLVar4->corkedSocket == this) {
      if (0x4000 - pLVar4->corkOffset < local_1c) {
        pVar8 = uncork(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c
                       ,in_stack_ffffffffffffff9b);
        local_8.first = pVar8.first;
        local_8.second = pVar8.second;
        goto LAB_002225de;
      }
      memcpy(pLVar4->corkBuffer + pLVar4->corkOffset,local_18,(long)local_1c);
      pLVar4->corkOffset = local_1c + pLVar4->corkOffset;
    }
    else {
      local_6c = us_socket_write(0,this,local_18,local_1c,local_24 != 0);
      if (local_6c < local_1c) {
        if ((local_1d & 1) == 0) {
          if (local_24 != 0) {
            std::__cxx11::string::length();
            std::__cxx11::string::reserve((ulong)this_00);
          }
          std::__cxx11::string::append((char *)this_00,(long)local_18 + (long)local_6c);
          local_6e = true;
          std::pair<int,_bool>::pair<int_&,_bool,_true>(&local_8,&local_1c,&local_6e);
        }
        else {
          local_6d = true;
          std::pair<int,_bool>::pair<int_&,_bool,_true>(&local_8,&local_6c,&local_6d);
        }
        goto LAB_002225de;
      }
    }
  }
  local_6f = false;
  std::pair<int,_bool>::pair<int_&,_bool,_true>(&local_8,&local_1c,&local_6f);
LAB_002225de:
  return CONCAT44(local_8._4_4_,local_8.first);
}

Assistant:

std::pair<int, bool> write(const char *src, int length, bool optionally = false, int nextLength = 0) {
        /* Fake success if closed, simple fix to allow uncork of closed socket to succeed */
        if (us_socket_is_closed(SSL, (us_socket_t *) this)) {
            return {length, false};
        }

        LoopData *loopData = getLoopData();
        AsyncSocketData<SSL> *asyncSocketData = getAsyncSocketData();

        /* We are limited if we have a per-socket buffer */
        if (asyncSocketData->buffer.length()) {
            /* Write off as much as we can */
            int written = us_socket_write(SSL, (us_socket_t *) this, asyncSocketData->buffer.data(), (int) asyncSocketData->buffer.length(), /*nextLength != 0 | */length);

            /* On failure return, otherwise continue down the function */
            if ((unsigned int) written < asyncSocketData->buffer.length()) {

                /* Update buffering (todo: we can do better here if we keep track of what happens to this guy later on) */
                asyncSocketData->buffer = asyncSocketData->buffer.substr(written);

                if (optionally) {
                    /* Thankfully we can exit early here */
                    return {0, true};
                } else {
                    /* This path is horrible and points towards erroneous usage */
                    asyncSocketData->buffer.append(src, length);

                    return {length, true};
                }
            }

            /* At this point we simply have no buffer and can continue as normal */
            asyncSocketData->buffer.clear();
        }

        if (length) {
            if (loopData->corkedSocket == this) {
                /* We are corked */
                if (LoopData::CORK_BUFFER_SIZE - loopData->corkOffset >= length) {
                    /* If the entire chunk fits in cork buffer */
                    memcpy(loopData->corkBuffer + loopData->corkOffset, src, length);
                    loopData->corkOffset += length;
                    /* Fall through to default return */
                } else {
                    /* Strategy differences between SSL and non-SSL regarding syscall minimizing */
                    if constexpr (SSL) {
                        /* Cork up as much as we can */
                        int stripped = LoopData::CORK_BUFFER_SIZE - loopData->corkOffset;
                        memcpy(loopData->corkBuffer + loopData->corkOffset, src, stripped);
                        loopData->corkOffset = LoopData::CORK_BUFFER_SIZE;

                        auto [written, failed] = uncork(src + stripped, length - stripped, optionally);
                        return {written + stripped, failed};
                    }

                    /* For non-SSL we take the penalty of two syscalls */
                    return uncork(src, length, optionally);
                }
            } else {
                /* We are not corked */
                int written = us_socket_write(SSL, (us_socket_t *) this, src, length, nextLength != 0);

                /* Did we fail? */
                if (written < length) {
                    /* If the write was optional then just bail out */
                    if (optionally) {
                        return {written, true};
                    }

                    /* Fall back to worst possible case (should be very rare for HTTP) */
                    /* At least we can reserve room for next chunk if we know it up front */
                    if (nextLength) {
                        asyncSocketData->buffer.reserve(asyncSocketData->buffer.length() + length - written + nextLength);
                    }

                    /* Buffer this chunk */
                    asyncSocketData->buffer.append(src + written, length - written);

                    /* Return the failure */
                    return {length, true};
                }
                /* Fall through to default return */
            }
        }

        /* Default fall through return */
        return {length, false};
    }